

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cancellation_signal.hpp
# Opt level: O1

pair<void_*,_unsigned_long> __thiscall
asio::cancellation_slot::prepare_memory(cancellation_slot *this,size_t size,size_t align)

{
  cancellation_handler_base *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  void *pvVar3;
  ulong uVar4;
  ulong extraout_RDX;
  undefined8 uVar5;
  long in_FS_OFFSET;
  pair<void_*,_unsigned_long> pVar6;
  
  if (this->handler_ == (cancellation_handler_base **)0x0) {
    __assert_fail("handler_",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/discordpp/lib/asio/asio/include/asio/cancellation_signal.hpp"
                  ,0x131,
                  "std::pair<void *, std::size_t> asio::cancellation_slot::prepare_memory(std::size_t, std::size_t)"
                 );
  }
  pcVar1 = *this->handler_;
  if (pcVar1 == (cancellation_handler_base *)0x0) {
    uVar4 = 0;
    pvVar3 = (void *)0x0;
  }
  else {
    iVar2 = (*pcVar1->_vptr_cancellation_handler_base[1])();
    pvVar3 = (void *)CONCAT44(extraout_var,iVar2);
    *this->handler_ = (cancellation_handler_base *)0x0;
    uVar4 = extraout_RDX;
  }
  if ((uVar4 < size) || ((ulong)pvVar3 % align != 0)) {
    if (pvVar3 != (void *)0x0) {
      if (*(long *)(in_FS_OFFSET + -8) == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
      }
      detail::thread_info_base::deallocate<asio::detail::thread_info_base::cancellation_signal_tag>
                (uVar5,pvVar3,uVar4);
    }
    if (*(long *)(in_FS_OFFSET + -8) == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
    }
    pvVar3 = detail::thread_info_base::
             allocate<asio::detail::thread_info_base::cancellation_signal_tag>(uVar5,size,align);
    uVar4 = size;
  }
  pVar6.second = uVar4;
  pVar6.first = pvVar3;
  return pVar6;
}

Assistant:

std::pair<void*, std::size_t> prepare_memory(
      std::size_t size, std::size_t align)
  {
    assert(handler_);
    std::pair<void*, std::size_t> mem;
    if (*handler_)
    {
      mem = (*handler_)->destroy();
      *handler_ = 0;
    }
    if (size > mem.second
        || reinterpret_cast<std::size_t>(mem.first) % align != 0)
    {
      if (mem.first)
      {
        detail::thread_info_base::deallocate(
            detail::thread_info_base::cancellation_signal_tag(),
            detail::thread_context::top_of_thread_call_stack(),
            mem.first, mem.second);
      }
      mem.first = detail::thread_info_base::allocate(
          detail::thread_info_base::cancellation_signal_tag(),
          detail::thread_context::top_of_thread_call_stack(),
          size, align);
      mem.second = size;
    }
    return mem;
  }